

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_custom_test.cpp
# Opt level: O1

size_t format_serialize(void *context,void *buffer,size_t size,char *time,uint64_t id,size_t line,
                       char *func,char *file,char *level,char *message,
                       log_policy_format_custom_va_list args)

{
  int iVar1;
  long lVar2;
  va_list va;
  
  iVar1 = snprintf((char *)buffer,size,"%.19s #%zu %s:%zu %s @%s ",time,id,file,line,func,level);
  lVar2 = (long)iVar1;
  if (args == (log_policy_format_custom_va_list)0x0) {
    iVar1 = snprintf((char *)((long)buffer + lVar2),size - lVar2,"%s",message);
  }
  else {
    va[0].reg_save_area = args->va[0].reg_save_area;
    va[0].gp_offset = args->va[0].gp_offset;
    va[0].fp_offset = args->va[0].fp_offset;
    va[0].overflow_arg_area = args->va[0].overflow_arg_area;
    iVar1 = vsnprintf((char *)((long)buffer + lVar2),size - lVar2,message,va);
  }
  return iVar1 + lVar2 + 1;
}

Assistant:

size_t format_serialize(void *context, void *buffer, const size_t size, const char *time, uint64_t id, size_t line, const char *func, const char *file, const char *level, const char *message, log_policy_format_custom_va_list args)
{
	size_t length = snprintf((char *)buffer, size, format, time, id, file, line, func, level);
	char *body = &(((char *)buffer)[length]);

	(void)context;

	if (args != NULL)
	{
		va_list va;

		va_copy(va, args->va);

		length += vsnprintf(body, size - length, message, va);

		va_end(va);
	}
	else
	{
		length += snprintf(body, size - length, "%s", message);
	}

	return length + 1;
}